

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

int __thiscall
chrono::collision::ChConvexDecompositionHACDv2::ComputeConvexDecomposition
          (ChConvexDecompositionHACDv2 *this)

{
  pointer pCVar1;
  pointer pCVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  HaU32 *pHVar6;
  HaF32 *pHVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> triangles_FUSED;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points_FUSED;
  MyCallback callback;
  
  if (this->gHACD == (HACD_API *)0x0) {
    iVar3 = 0;
  }
  else {
    triangles_FUSED.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    points_FUSED.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    points_FUSED.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    points_FUSED.
    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    triangles_FUSED.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    triangles_FUSED.
    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    FuseMesh(&this->points,&this->triangles,&points_FUSED,&triangles_FUSED,this->fuse_tol);
    pCVar2 = points_FUSED.
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = triangles_FUSED.
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)triangles_FUSED.
                   super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)triangles_FUSED.
                  super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xc;
    (this->descriptor).mTriangleCount = (HaU32)uVar4;
    uVar5 = ((long)points_FUSED.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)points_FUSED.
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    (this->descriptor).mVertexCount = (HaU32)uVar5;
    pHVar6 = (HaU32 *)operator_new__((long)triangles_FUSED.
                                           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)triangles_FUSED.
                                           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start & 0x3fffffffc);
    (this->descriptor).mIndices = pHVar6;
    pHVar7 = (HaF32 *)operator_new__(uVar5 * 0xc & 0x3fffffffc);
    uVar9 = 0;
    (this->descriptor).mVertices = pHVar7;
    uVar8 = 2;
    while( true ) {
      uVar10 = (ulong)uVar9;
      if (uVar5 <= uVar10) break;
      uVar9 = uVar9 + 1;
      pHVar7[uVar8 - 2] = (HaF32)(float)pCVar2[uVar10].m_data[0];
      pHVar7[uVar8 - 1] = (HaF32)(float)pCVar2[uVar10].m_data[1];
      uVar11 = (ulong)uVar8;
      uVar8 = uVar8 + 3;
      pHVar7[uVar11] = (HaF32)(float)pCVar2[uVar10].m_data[2];
    }
    uVar8 = 2;
    for (uVar9 = 0; uVar5 = (ulong)uVar9, uVar5 < uVar4; uVar9 = uVar9 + 1) {
      pHVar6[uVar8 - 2] = pCVar1[uVar5].m_data[0];
      pHVar6[uVar8 - 1] = pCVar1[uVar5].m_data[1];
      uVar10 = (ulong)uVar8;
      uVar8 = uVar8 + 3;
      pHVar6[uVar10] = pCVar1[uVar5].m_data[2];
    }
    callback.super_ICallback._vptr_ICallback = (ICallback)&PTR_ReportProgress_01189048;
    (this->descriptor).mCallback = &callback.super_ICallback;
    iVar3 = (**this->gHACD->_vptr_HACD_API)(this->gHACD,&this->descriptor);
    pHVar6 = (this->descriptor).mIndices;
    if (pHVar6 != (HaU32 *)0x0) {
      operator_delete__(pHVar6);
    }
    pHVar7 = (this->descriptor).mVertices;
    if (pHVar7 != (HaF32 *)0x0) {
      operator_delete__(pHVar7);
    }
    (this->descriptor).mTriangleCount = 0;
    (this->descriptor).mVertexCount = 0;
    std::_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::~_Vector_base
              (&triangles_FUSED.
                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>);
    std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
    ~_Vector_base(&points_FUSED.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 );
  }
  return iVar3;
}

Assistant:

int ChConvexDecompositionHACDv2::ComputeConvexDecomposition() {
    if (!gHACD)
        return 0;

    // Preprocess: fuse repeated vertices...

    std::vector<ChVector<double> > points_FUSED;
    std::vector<ChVector<int> > triangles_FUSED;
    FuseMesh(this->points, this->triangles, points_FUSED, triangles_FUSED, this->fuse_tol);

    // Convert to HACD format

    this->descriptor.mTriangleCount = (hacd::HaU32)triangles_FUSED.size();
    this->descriptor.mVertexCount = (hacd::HaU32)points_FUSED.size();
    this->descriptor.mIndices = new hacd::HaU32[3 * this->descriptor.mTriangleCount];
    this->descriptor.mVertices = new hacd::HaF32[3 * this->descriptor.mVertexCount];
    for (unsigned int mv = 0; mv < points_FUSED.size(); mv++) {
        ((hacd::HaF32*)descriptor.mVertices)[mv * 3 + 0] = (float)points_FUSED[mv].x();
        ((hacd::HaF32*)descriptor.mVertices)[mv * 3 + 1] = (float)points_FUSED[mv].y();
        ((hacd::HaF32*)descriptor.mVertices)[mv * 3 + 2] = (float)points_FUSED[mv].z();
    }
    for (unsigned int mt = 0; mt < triangles_FUSED.size(); mt++) {
        ((hacd::HaU32*)descriptor.mIndices)[mt * 3 + 0] = triangles_FUSED[mt].x();
        ((hacd::HaU32*)descriptor.mIndices)[mt * 3 + 1] = triangles_FUSED[mt].y();
        ((hacd::HaU32*)descriptor.mIndices)[mt * 3 + 2] = triangles_FUSED[mt].z();
    }

    MyCallback callback;
    descriptor.mCallback = static_cast<hacd::ICallback*>(&callback);

    // Perform the decomposition!

    hacd::HaU32 hullCount = gHACD->performHACD(this->descriptor);

    delete[] this->descriptor.mIndices;
    delete[] this->descriptor.mVertices;
    this->descriptor.mTriangleCount = 0;
    this->descriptor.mVertexCount = 0;

    return hullCount;
}